

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_container_unit.c
# Opt level: O1

void add_contains_test(void)

{
  ushort uVar1;
  uint16_t *puVar2;
  int iVar3;
  array_container_t *container;
  byte bVar4;
  int iVar5;
  ulong unaff_RBP;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  unsigned_long uVar11;
  size_t x;
  ulong uVar12;
  ushort uVar13;
  size_t x_1;
  unsigned_long uVar14;
  long lVar15;
  bool bVar16;
  
  container = array_container_create();
  _assert_true((unsigned_long)container,"B",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x27);
  uVar14 = 0;
  uVar13 = 0;
LAB_00104311:
  iVar3 = container->cardinality;
  uVar12 = (ulong)iVar3;
  if ((uVar12 == 0) || ((iVar3 != 0x7fffffff && (container->array[uVar12 - 1] < uVar13)))) {
    if (iVar3 == container->capacity) {
      array_container_grow(container,container->capacity + 1,true);
    }
    iVar3 = container->cardinality;
    container->cardinality = iVar3 + 1;
    container->array[iVar3] = uVar13;
LAB_0010435e:
    uVar11 = 1;
  }
  else {
    iVar5 = iVar3 + -1;
    uVar10 = 0;
    uVar7 = unaff_RBP;
    do {
      if (iVar5 < (int)uVar10) {
        unaff_RBP = (ulong)~uVar10;
        break;
      }
      uVar9 = uVar10 + iVar5 >> 1;
      unaff_RBP = (ulong)uVar9;
      uVar1 = *(ushort *)((long)container->array + (ulong)(uVar10 + iVar5 & 0xfffffffe));
      if (uVar1 < uVar13) {
        uVar10 = uVar9 + 1;
        bVar16 = true;
        unaff_RBP = uVar7;
      }
      else if (uVar13 < uVar1) {
        iVar5 = uVar9 - 1;
        bVar16 = true;
        unaff_RBP = uVar7;
      }
      else {
        bVar16 = false;
      }
      uVar7 = unaff_RBP;
    } while (bVar16);
    if (iVar3 == 0x7fffffff) {
      uVar11 = 0;
    }
    else {
      uVar11 = 0;
      if ((int)(uint)unaff_RBP < 0) {
        if (iVar3 == container->capacity) {
          array_container_grow(container,container->capacity + 1,true);
        }
        uVar10 = ~(uint)unaff_RBP;
        unaff_RBP = (ulong)uVar10;
        uVar10 = iVar3 - uVar10;
        uVar12 = (ulong)uVar10;
        memmove(container->array + unaff_RBP + 1,container->array + unaff_RBP,(long)(int)uVar10 * 2)
        ;
        container->array[unaff_RBP] = uVar13;
        container->cardinality = container->cardinality + 1;
        goto LAB_0010435e;
      }
    }
  }
  _assert_true(uVar11,"array_container_add(B, x)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x2c);
  iVar3 = container->cardinality + -1;
  uVar10 = 0;
  do {
    if (iVar3 < (int)(uVar10 + 0x10)) {
      if (iVar3 < (int)uVar10) {
        uVar11 = 0;
        goto LAB_0010443a;
      }
      bVar4 = 1;
      lVar15 = 0;
      goto LAB_00104412;
    }
    uVar9 = uVar10 + iVar3 >> 1;
    uVar1 = *(ushort *)((long)container->array + (ulong)(uVar10 + iVar3 & 0xfffffffe));
    iVar5 = uVar9 - 1;
    if (uVar1 <= uVar13) {
      iVar5 = iVar3;
    }
    uVar9 = uVar9 + 1;
    if (uVar13 <= uVar1) {
      uVar9 = uVar10;
      iVar3 = iVar5;
    }
    uVar10 = uVar9;
  } while (uVar1 != uVar13);
  uVar11 = 1;
  goto LAB_0010443a;
  while (lVar15 = lVar15 + 1, (iVar3 - uVar10) + 1 != (int)lVar15) {
LAB_00104412:
    uVar1 = container->array[(ulong)uVar10 + lVar15];
    bVar4 = bVar4 & uVar1 <= uVar13 | uVar1 == uVar13;
    if (uVar13 <= uVar1) goto LAB_00104437;
  }
  bVar4 = 0;
LAB_00104437:
  uVar11 = (unsigned_long)bVar4;
LAB_0010443a:
  _assert_true(uVar11,"array_container_contains(B, x)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x2d);
  uVar14 = uVar14 + 1;
  _assert_int_equal((long)container->cardinality,uVar14,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                    ,0x2e);
  _assert_true((ulong)(container->cardinality <= container->capacity),"B->cardinality > B->capacity"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x2f);
  uVar13 = uVar13 + 3;
  if (uVar14 == 0x5556) goto LAB_001044fe;
  goto LAB_00104311;
LAB_001044fe:
  lVar15 = 0;
LAB_00104512:
  iVar3 = container->cardinality + -1;
  uVar10 = 0;
  do {
    uVar13 = (ushort)lVar15;
    if (iVar3 < (int)(uVar10 + 0x10)) {
      if (iVar3 < (int)uVar10) {
        uVar14 = 0;
        goto LAB_0010458e;
      }
      bVar4 = 1;
      lVar8 = 0;
      goto LAB_00104566;
    }
    uVar9 = uVar10 + iVar3 >> 1;
    uVar1 = *(ushort *)((long)container->array + (ulong)(uVar10 + iVar3 & 0xfffffffe));
    iVar5 = uVar9 - 1;
    if (uVar1 < uVar13 || uVar1 == uVar13) {
      iVar5 = iVar3;
    }
    uVar9 = uVar9 + 1;
    if (uVar1 >= uVar13) {
      uVar9 = uVar10;
      iVar3 = iVar5;
    }
    uVar10 = uVar9;
  } while (uVar1 != uVar13);
  uVar14 = 1;
  goto LAB_0010458e;
  while (lVar8 = lVar8 + 1, (iVar3 - uVar10) + 1 != (int)lVar8) {
LAB_00104566:
    uVar1 = container->array[(ulong)uVar10 + lVar8];
    bVar4 = bVar4 & uVar1 <= uVar13 | uVar1 == uVar13;
    if (uVar13 <= uVar1) goto LAB_0010458b;
  }
  bVar4 = 0;
LAB_0010458b:
  uVar14 = (unsigned_long)bVar4;
LAB_0010458e:
  _assert_int_equal(uVar14,(ulong)((ulong)(lVar15 * -0x5555555555555555) < 0x5555555555555556),
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                    ,0x33);
  lVar15 = lVar15 + 1;
  if (lVar15 == 0x10000) goto code_r0x001045c5;
  goto LAB_00104512;
code_r0x001045c5:
  uVar14 = 0x5556;
  _assert_int_equal((long)container->cardinality,0x5556,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                    ,0x36);
  uVar7 = 0;
LAB_001045f0:
  iVar3 = container->cardinality + -1;
  uVar10 = 0;
  do {
    uVar13 = (ushort)uVar7;
    if (iVar3 < (int)(uVar10 + 0x10)) {
      if (iVar3 < (int)uVar10) {
        uVar11 = 0;
        goto LAB_00104669;
      }
      bVar4 = 1;
      lVar15 = 0;
      goto LAB_00104643;
    }
    uVar9 = uVar10 + iVar3 >> 1;
    uVar1 = *(ushort *)((long)container->array + (ulong)(uVar10 + iVar3 & 0xfffffffe));
    iVar5 = uVar9 - 1;
    if (uVar1 < uVar13 || uVar1 == uVar13) {
      iVar5 = iVar3;
    }
    uVar9 = uVar9 + 1;
    if (uVar1 >= uVar13) {
      uVar9 = uVar10;
      iVar3 = iVar5;
    }
    uVar10 = uVar9;
  } while (uVar1 != uVar13);
  uVar11 = 1;
  goto LAB_00104669;
  while (lVar15 = lVar15 + 1, (iVar3 - uVar10) + 1 != (int)lVar15) {
LAB_00104643:
    uVar1 = container->array[(ulong)uVar10 + lVar15];
    bVar4 = bVar4 & uVar1 <= uVar13 | uVar1 == uVar13;
    if (uVar13 <= uVar1) goto LAB_00104666;
  }
  bVar4 = 0;
LAB_00104666:
  uVar11 = (unsigned_long)bVar4;
LAB_00104669:
  _assert_true(uVar11,"array_container_contains(B, x)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x39);
  puVar2 = container->array;
  iVar3 = container->cardinality + -1;
  uVar10 = 0;
  do {
    if (iVar3 < (int)uVar10) {
      uVar12 = (ulong)~uVar10;
      break;
    }
    uVar9 = uVar10 + iVar3 >> 1;
    uVar1 = *(ushort *)((long)puVar2 + (ulong)(uVar10 + iVar3 & 0xfffffffe));
    if (uVar1 < uVar13) {
      uVar10 = uVar9 + 1;
      bVar16 = true;
    }
    else if (uVar13 < uVar1) {
      iVar3 = uVar9 - 1;
      bVar16 = true;
    }
    else {
      bVar16 = false;
      uVar12 = (ulong)uVar9;
    }
  } while (bVar16);
  uVar10 = (uint)uVar12;
  if (-1 < (int)uVar10) {
    memmove(puVar2 + (uVar12 & 0xffffffff),puVar2 + (uVar12 & 0xffffffff) + 1,
            (long)(int)(container->cardinality + ~uVar10) * 2);
    container->cardinality = container->cardinality + -1;
  }
  _assert_true((ulong)(-1 < (int)uVar10),"array_container_remove(B, x)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x3a);
  uVar14 = uVar14 - 1;
  _assert_int_equal((long)container->cardinality,uVar14,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                    ,0x3b);
  iVar3 = container->cardinality + -1;
  uVar10 = 0;
  do {
    if (iVar3 < (int)(uVar10 + 0x10)) {
      uVar11 = 1;
      if (iVar3 < (int)uVar10) goto LAB_0010479b;
      bVar4 = 1;
      lVar15 = 0;
      goto LAB_00104772;
    }
    uVar9 = uVar10 + iVar3 >> 1;
    uVar1 = *(ushort *)((long)container->array + (ulong)(uVar10 + iVar3 & 0xfffffffe));
    iVar5 = uVar9 - 1;
    if (uVar1 <= uVar13) {
      iVar5 = iVar3;
    }
    uVar9 = uVar9 + 1;
    if (uVar13 <= uVar1) {
      uVar9 = uVar10;
      iVar3 = iVar5;
    }
    uVar10 = uVar9;
  } while (uVar1 != uVar13);
  uVar11 = 0;
LAB_0010479b:
  _assert_true(uVar11,"array_container_contains(B, x)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x3c);
  uVar6 = uVar7 + 3;
  bVar16 = 0xfffc < uVar7;
  uVar7 = uVar6;
  if (bVar16) goto code_r0x001047bf;
  goto LAB_001045f0;
  while (lVar15 = lVar15 + 1, (iVar3 - uVar10) + 1 != (int)lVar15) {
LAB_00104772:
    uVar1 = container->array[(ulong)uVar10 + lVar15];
    bVar4 = bVar4 & uVar1 <= uVar13 | uVar1 == uVar13;
    if (uVar13 <= uVar1) goto LAB_00104795;
  }
  bVar4 = 0;
LAB_00104795:
  uVar11 = (unsigned_long)(bVar4 ^ 1);
  goto LAB_0010479b;
code_r0x001047bf:
  uVar14 = 0;
  _assert_int_equal((long)container->cardinality,0,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                    ,0x3f);
  uVar13 = 0xffff;
LAB_001047e1:
  iVar3 = container->cardinality;
  uVar12 = (ulong)iVar3;
  if ((uVar12 == 0) || ((iVar3 != 0x7fffffff && (container->array[uVar12 - 1] < uVar13)))) {
    if (iVar3 == container->capacity) {
      array_container_grow(container,container->capacity + 1,true);
    }
    iVar3 = container->cardinality;
    container->cardinality = iVar3 + 1;
    container->array[iVar3] = uVar13;
LAB_0010482e:
    uVar11 = 1;
  }
  else {
    iVar5 = iVar3 + -1;
    uVar10 = 0;
    uVar7 = uVar6;
    do {
      if (iVar5 < (int)uVar10) {
        uVar6 = (ulong)~uVar10;
        break;
      }
      uVar9 = uVar10 + iVar5 >> 1;
      uVar6 = (ulong)uVar9;
      uVar1 = *(ushort *)((long)container->array + (ulong)(uVar10 + iVar5 & 0xfffffffe));
      if (uVar1 < uVar13) {
        uVar10 = uVar9 + 1;
        bVar16 = true;
        uVar6 = uVar7;
      }
      else if (uVar13 < uVar1) {
        iVar5 = uVar9 - 1;
        bVar16 = true;
        uVar6 = uVar7;
      }
      else {
        bVar16 = false;
      }
      uVar7 = uVar6;
    } while (bVar16);
    if (iVar3 == 0x7fffffff) {
      uVar11 = 0;
    }
    else {
      uVar11 = 0;
      if ((int)(uint)uVar6 < 0) {
        if (iVar3 == container->capacity) {
          array_container_grow(container,container->capacity + 1,true);
        }
        uVar10 = ~(uint)uVar6;
        uVar6 = (ulong)uVar10;
        uVar10 = iVar3 - uVar10;
        uVar12 = (ulong)uVar10;
        memmove(container->array + uVar6 + 1,container->array + uVar6,(long)(int)uVar10 * 2);
        container->array[uVar6] = uVar13;
        container->cardinality = container->cardinality + 1;
        goto LAB_0010482e;
      }
    }
  }
  _assert_true(uVar11,"array_container_add(B, x)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x42);
  iVar3 = container->cardinality + -1;
  uVar10 = 0;
  do {
    if (iVar3 < (int)(uVar10 + 0x10)) {
      if (iVar3 < (int)uVar10) {
        uVar11 = 0;
        goto LAB_0010490a;
      }
      bVar4 = 1;
      lVar15 = 0;
      goto LAB_001048e2;
    }
    uVar9 = uVar10 + iVar3 >> 1;
    uVar1 = *(ushort *)((long)container->array + (ulong)(uVar10 + iVar3 & 0xfffffffe));
    iVar5 = uVar9 - 1;
    if (uVar1 <= uVar13) {
      iVar5 = iVar3;
    }
    uVar9 = uVar9 + 1;
    if (uVar13 <= uVar1) {
      uVar9 = uVar10;
      iVar3 = iVar5;
    }
    uVar10 = uVar9;
  } while (uVar1 != uVar13);
  uVar11 = 1;
  goto LAB_0010490a;
  while (lVar15 = lVar15 + 1, (iVar3 - uVar10) + 1 != (int)lVar15) {
LAB_001048e2:
    uVar1 = container->array[(ulong)uVar10 + lVar15];
    bVar4 = bVar4 & uVar1 <= uVar13 | uVar1 == uVar13;
    if (uVar13 <= uVar1) goto LAB_00104907;
  }
  bVar4 = 0;
LAB_00104907:
  uVar11 = (unsigned_long)bVar4;
LAB_0010490a:
  _assert_true(uVar11,"array_container_contains(B, x)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x43);
  uVar14 = uVar14 + 1;
  _assert_int_equal((long)container->cardinality,uVar14,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                    ,0x44);
  _assert_true((ulong)(container->cardinality <= container->capacity),"B->cardinality > B->capacity"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x45);
  uVar13 = uVar13 - 3;
  if (uVar14 == 0x5556) goto LAB_001049ce;
  goto LAB_001047e1;
LAB_001049ce:
  _assert_int_equal((long)container->cardinality,0x5556,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                    ,0x48);
  lVar15 = 0;
LAB_001049f7:
  iVar3 = container->cardinality + -1;
  uVar10 = 0;
  do {
    uVar13 = (ushort)lVar15;
    if (iVar3 < (int)(uVar10 + 0x10)) {
      if (iVar3 < (int)uVar10) {
        uVar14 = 0;
        goto LAB_00104a73;
      }
      bVar4 = 1;
      lVar8 = 0;
      goto LAB_00104a4b;
    }
    uVar9 = uVar10 + iVar3 >> 1;
    uVar1 = *(ushort *)((long)container->array + (ulong)(uVar10 + iVar3 & 0xfffffffe));
    iVar5 = uVar9 - 1;
    if (uVar1 < uVar13 || uVar1 == uVar13) {
      iVar5 = iVar3;
    }
    uVar9 = uVar9 + 1;
    if (uVar1 >= uVar13) {
      uVar9 = uVar10;
      iVar3 = iVar5;
    }
    uVar10 = uVar9;
  } while (uVar1 != uVar13);
  uVar14 = 1;
  goto LAB_00104a73;
  while (lVar8 = lVar8 + 1, (iVar3 - uVar10) + 1 != (int)lVar8) {
LAB_00104a4b:
    uVar1 = container->array[(ulong)uVar10 + lVar8];
    bVar4 = bVar4 & uVar1 <= uVar13 | uVar1 == uVar13;
    if (uVar13 <= uVar1) goto LAB_00104a70;
  }
  bVar4 = 0;
LAB_00104a70:
  uVar14 = (unsigned_long)bVar4;
LAB_00104a73:
  _assert_int_equal(uVar14,(ulong)((ulong)(lVar15 * -0x5555555555555555) < 0x5555555555555556),
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                    ,0x4b);
  lVar15 = lVar15 + 1;
  if (lVar15 == 0x10000) goto code_r0x00104aaa;
  goto LAB_001049f7;
code_r0x00104aaa:
  uVar14 = 0x5556;
  uVar7 = 0;
LAB_00104ac0:
  iVar3 = container->cardinality + -1;
  uVar10 = 0;
  do {
    uVar13 = (ushort)uVar7;
    if (iVar3 < (int)(uVar10 + 0x10)) {
      if (iVar3 < (int)uVar10) {
        uVar11 = 0;
        goto LAB_00104b39;
      }
      bVar4 = 1;
      lVar15 = 0;
      goto LAB_00104b13;
    }
    uVar9 = uVar10 + iVar3 >> 1;
    uVar1 = *(ushort *)((long)container->array + (ulong)(uVar10 + iVar3 & 0xfffffffe));
    iVar5 = uVar9 - 1;
    if (uVar1 < uVar13 || uVar1 == uVar13) {
      iVar5 = iVar3;
    }
    uVar9 = uVar9 + 1;
    if (uVar1 >= uVar13) {
      uVar9 = uVar10;
      iVar3 = iVar5;
    }
    uVar10 = uVar9;
  } while (uVar1 != uVar13);
  uVar11 = 1;
  goto LAB_00104b39;
  while (lVar15 = lVar15 + 1, (iVar3 - uVar10) + 1 != (int)lVar15) {
LAB_00104b13:
    uVar1 = container->array[(ulong)uVar10 + lVar15];
    bVar4 = bVar4 & uVar1 <= uVar13 | uVar1 == uVar13;
    if (uVar13 <= uVar1) goto LAB_00104b36;
  }
  bVar4 = 0;
LAB_00104b36:
  uVar11 = (unsigned_long)bVar4;
LAB_00104b39:
  _assert_true(uVar11,"array_container_contains(B, x)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x4f);
  puVar2 = container->array;
  iVar3 = container->cardinality + -1;
  uVar10 = 0;
  do {
    if (iVar3 < (int)uVar10) {
      uVar12 = (ulong)~uVar10;
      break;
    }
    uVar9 = uVar10 + iVar3 >> 1;
    uVar1 = *(ushort *)((long)puVar2 + (ulong)(uVar10 + iVar3 & 0xfffffffe));
    if (uVar1 < uVar13) {
      uVar10 = uVar9 + 1;
      bVar16 = true;
    }
    else if (uVar13 < uVar1) {
      iVar3 = uVar9 - 1;
      bVar16 = true;
    }
    else {
      bVar16 = false;
      uVar12 = (ulong)uVar9;
    }
  } while (bVar16);
  uVar10 = (uint)uVar12;
  if (-1 < (int)uVar10) {
    memmove(puVar2 + (uVar12 & 0xffffffff),puVar2 + (uVar12 & 0xffffffff) + 1,
            (long)(int)(container->cardinality + ~uVar10) * 2);
    container->cardinality = container->cardinality + -1;
  }
  _assert_true((ulong)(-1 < (int)uVar10),"array_container_remove(B, x)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x50);
  uVar14 = uVar14 - 1;
  _assert_int_equal((long)container->cardinality,uVar14,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                    ,0x51);
  iVar3 = container->cardinality + -1;
  uVar10 = 0;
  do {
    if (iVar3 < (int)(uVar10 + 0x10)) {
      uVar11 = 1;
      if (iVar3 < (int)uVar10) goto LAB_00104c6b;
      bVar4 = 1;
      lVar15 = 0;
      goto LAB_00104c42;
    }
    uVar9 = uVar10 + iVar3 >> 1;
    uVar1 = *(ushort *)((long)container->array + (ulong)(uVar10 + iVar3 & 0xfffffffe));
    iVar5 = uVar9 - 1;
    if (uVar1 <= uVar13) {
      iVar5 = iVar3;
    }
    uVar9 = uVar9 + 1;
    if (uVar13 <= uVar1) {
      uVar9 = uVar10;
      iVar3 = iVar5;
    }
    uVar10 = uVar9;
  } while (uVar1 != uVar13);
  uVar11 = 0;
LAB_00104c6b:
  _assert_true(uVar11,"array_container_contains(B, x)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x52);
  bVar16 = 0xfffc < uVar7;
  uVar7 = uVar7 + 3;
  if (bVar16) {
    array_container_free(container);
    return;
  }
  goto LAB_00104ac0;
  while (lVar15 = lVar15 + 1, (iVar3 - uVar10) + 1 != (int)lVar15) {
LAB_00104c42:
    uVar1 = container->array[(ulong)uVar10 + lVar15];
    bVar4 = bVar4 & uVar1 <= uVar13 | uVar1 == uVar13;
    if (uVar13 <= uVar1) goto LAB_00104c65;
  }
  bVar4 = 0;
LAB_00104c65:
  uVar11 = (unsigned_long)(bVar4 ^ 1);
  goto LAB_00104c6b;
}

Assistant:

DEFINE_TEST(add_contains_test) {
    array_container_t* B = array_container_create();
    assert_non_null(B);

    int expected_card = 0;

    for (size_t x = 0; x < 1 << 16; x += 3) {
        assert_true(array_container_add(B, x));
        assert_true(array_container_contains(B, x));
        assert_int_equal(B->cardinality, ++expected_card);
        assert_false(B->cardinality > B->capacity);
    }

    for (size_t x = 0; x < 1 << 16; x++) {
        assert_int_equal(array_container_contains(B, x), (x / 3 * 3 == x));
    }

    assert_int_equal(array_container_cardinality(B), (1 << 16) / 3 + 1);

    for (size_t x = 0; x < 1 << 16; x += 3) {
        assert_true(array_container_contains(B, x));
        assert_true(array_container_remove(B, x));
        assert_int_equal(B->cardinality, --expected_card);
        assert_false(array_container_contains(B, x));
    }

    assert_int_equal(array_container_cardinality(B), 0);

    for (int x = 65535; x >= 0; x -= 3) {
        assert_true(array_container_add(B, x));
        assert_true(array_container_contains(B, x));
        assert_int_equal(B->cardinality, ++expected_card);
        assert_false(B->cardinality > B->capacity);
    }

    assert_int_equal(array_container_cardinality(B), expected_card);

    for (size_t x = 0; x < 1 << 16; x++) {
        assert_int_equal(array_container_contains(B, x), (x / 3 * 3 == x));
    }

    for (size_t x = 0; x < 1 << 16; x += 3) {
        assert_true(array_container_contains(B, x));
        assert_true(array_container_remove(B, x));
        assert_int_equal(B->cardinality, --expected_card);
        assert_false(array_container_contains(B, x));
    }

    array_container_free(B);
}